

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DNATypes.cpp
# Opt level: O1

void DNA::print(Base *dna,size_t dna_size)

{
  size_t sVar1;
  
  if (dna_size != 0) {
    sVar1 = 0;
    do {
      if ((ulong)dna[sVar1] < 4) {
        putc(*(int *)(&DAT_0010209c + (ulong)dna[sVar1] * 4),_stdout);
      }
      sVar1 = sVar1 + 1;
    } while (dna_size != sVar1);
  }
  return;
}

Assistant:

void DNA::print(const DNA::Base* dna, size_t dna_size)
{
    while (dna_size--) {
        switch (*dna++) {
             case DNA::A:
                 std::putc('A', stdout);
                 break;
             case DNA::C:
                 std::putc('C', stdout);
                 break;
             case DNA::G:
                 std::putc('G', stdout);
                 break;
             case DNA::T:
                 std::putc('T', stdout);
                 break;
        }
    }
}